

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

void __thiscall QVariant::load(QVariant *this,QDataStream *s)

{
  long lVar1;
  ulong uVar2;
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  void *data;
  QString x;
  QByteArray name;
  qint8 is_null;
  quint32 typeId;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QMetaType in_stack_fffffffffffffef8;
  QByteArray *in_stack_ffffffffffffff00;
  QDataStream *str;
  QDataStream *in_stack_ffffffffffffff38;
  QMessageLogger local_c0;
  QMetaTypeInterface *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QMessageLogger local_80;
  QMetaTypeInterface *local_50;
  QByteArray local_48;
  char local_29;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  clear((QVariant *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_c = 0xaaaaaaaa;
  QDataStream::operator>>
            ((QDataStream *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (quint32 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  iVar3 = QDataStream::version(in_RSI);
  if (6 < iVar3) {
    iVar3 = QDataStream::version(in_RSI);
    if (iVar3 < 0xd) {
      local_c = 0xaaaaaa49;
    }
    iVar3 = QDataStream::version(in_RSI);
    if (iVar3 < 0x14) {
      if (local_c == 0x400) {
        local_c = 0x10000;
      }
      else if ((local_c < 0x40) || (0x57 < local_c)) {
        if (local_c == 0x79) {
          local_c = 0x2000;
        }
        else if (local_c == 0x1b) {
          QByteArrayView::QByteArrayView<8ul>
                    ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                     ,(char (*) [8])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          typeName.m_size._4_4_ = in_stack_fffffffffffffeec;
          typeName.m_size._0_4_ = in_stack_fffffffffffffee8;
          typeName.m_data._0_4_ = in_stack_fffffffffffffef0;
          typeName.m_data._4_4_ = in_stack_fffffffffffffef4;
          QMetaType::fromName(typeName);
          local_c = QMetaType::id((QMetaType *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  in_stack_fffffffffffffedc);
        }
      }
      else {
        local_c = local_c + 0xfc0;
      }
    }
    local_29 = '\0';
    iVar3 = QDataStream::version(in_RSI);
    if (7 < iVar3) {
      QDataStream::operator>>
                ((QDataStream *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (qint8 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    if (local_c == 0x10000) {
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff00 = &local_48;
      QByteArray::QByteArray((QByteArray *)0x436ce3);
      ::operator>>(in_RDI,in_stack_ffffffffffffff00);
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      typeName_00.m_size._4_4_ = in_stack_fffffffffffffeec;
      typeName_00.m_size._0_4_ = in_stack_fffffffffffffee8;
      typeName_00.m_data._0_4_ = in_stack_fffffffffffffef0;
      typeName_00.m_data._4_4_ = in_stack_fffffffffffffef4;
      in_stack_fffffffffffffef8 = QMetaType::fromName(typeName_00);
      local_50 = in_stack_fffffffffffffef8.d_ptr;
      in_stack_fffffffffffffef4 =
           QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
      bVar7 = in_stack_fffffffffffffef4 == 0;
      if (bVar7) {
        QDataStream::setStatus(in_RSI,ReadCorruptData);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee4,
                   (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        pcVar5 = QByteArray::constData((QByteArray *)0x436d90);
        QMessageLogger::warning(&local_80,"QVariant::load: unknown user type with name %s.",pcVar5);
      }
      QByteArray::~QByteArray((QByteArray *)0x436dee);
      if (bVar7) goto LAB_00436f77;
    }
    create((QVariant *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
           in_stack_fffffffffffffeec,
           (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    uVar6._0_4_ = in_RDI->ver;
    uVar6._4_2_ = in_RDI->transactionDepth;
    uVar6._6_2_ = *(undefined2 *)&in_RDI->field_0x1e;
    uVar6 = uVar6 & 0xfffffffffffffffd | ((long)local_29 & 1U) << 1;
    in_RDI->ver = (int)uVar6;
    in_RDI->transactionDepth = (short)(uVar6 >> 0x20);
    *(short *)&in_RDI->field_0x1e = (short)(uVar6 >> 0x30);
    bVar7 = isValid((QVariant *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (bVar7) {
      constData((QVariant *)0x436eef);
      local_a0 = (QMetaTypeInterface *)
                 Private::type((Private *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      bVar7 = QMetaType::load((QMetaType *)in_stack_ffffffffffffff00,
                              (QDataStream *)in_stack_fffffffffffffef8.d_ptr,
                              (void *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
      if (((bVar7 ^ 0xffU) & 1) != 0) {
        QDataStream::setStatus(in_RSI,ReadCorruptData);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee4,
                   (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        Private::type((Private *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        uVar4 = QMetaType::id((QMetaType *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffedc);
        QMessageLogger::warning(&local_c0,"QVariant::load: unable to load type %d.",(ulong)uVar4);
      }
    }
    else {
      iVar3 = QDataStream::version(in_RSI);
      if (iVar3 < 0xd) {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x436e87);
        ::operator>>(in_stack_ffffffffffffff38,(QString *)str);
        QString::~QString((QString *)0x436ea5);
      }
      uVar2._0_4_ = in_RDI->ver;
      uVar2._4_2_ = in_RDI->transactionDepth;
      uVar2._6_2_ = *(undefined2 *)&in_RDI->field_0x1e;
      uVar6 = uVar2 & 0xfffffffffffffffd | 2;
      in_RDI->ver = (int)uVar6;
      in_RDI->transactionDepth = (short)(uVar6 >> 0x20);
      *(short *)&in_RDI->field_0x1e = (short)(uVar6 >> 0x30);
    }
  }
LAB_00436f77:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariant::load(QDataStream &s)
{
    clear();

    quint32 typeId;
    s >> typeId;
    if (s.version() < QDataStream::Qt_4_0) {
        // map to Qt 5 ids
        if (typeId >= MapFromThreeCount)
            return;
        typeId = mapIdFromQt3ToCurrent[typeId];
    } else if (s.version() < QDataStream::Qt_5_0) {
        // map to Qt 5 type ids
        if (typeId == 127 /* QVariant::UserType */) {
            typeId = Qt5UserType;
        } else if (typeId >= 128 && typeId != Qt5UserType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId -= 97;
        } else if (typeId == 75 /* QSizePolicy */) {
            typeId = Qt5SizePolicy;
        } else if (typeId > 75 && typeId <= 86) {
            // and as a result these types received lower ids too
            // QKeySequence QPen QTextLength QTextFormat QTransform QMatrix4x4 QVector2D QVector3D QVector4D QQuaternion
            typeId -=1;
        }
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map from Qt 5 to Qt 6 values
        if (typeId == Qt5UserType) {
            typeId = QMetaType::User;
        } else if (typeId >= Qt5FirstGuiType && typeId <= Qt5LastGuiType) {
            typeId += Qt6ToQt5GuiTypeDelta;
        } else if (typeId == Qt5SizePolicy) {
            typeId = QMetaType::QSizePolicy;
        } else if (typeId == Qt5RegExp) {
            typeId = QMetaType::fromName("QRegExp").id();
        }
    }

    qint8 is_null = false;
    if (s.version() >= QDataStream::Qt_4_2)
        s >> is_null;
    if (typeId == QMetaType::User) {
        QByteArray name;
        s >> name;
        typeId = QMetaType::fromName(name).id();
        if (typeId == QMetaType::UnknownType) {
            s.setStatus(QDataStream::ReadCorruptData);
            qWarning("QVariant::load: unknown user type with name %s.", name.constData());
            return;
        }
    }
    create(typeId, nullptr);
    d.is_null = is_null;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0) {
            // Since we wrote something, we should read something
            QString x;
            s >> x;
        }
        d.is_null = true;
        return;
    }

    // const cast is safe since we operate on a newly constructed variant
    void *data = const_cast<void *>(constData());
    if (!d.type().load(s, data)) {
        s.setStatus(QDataStream::ReadCorruptData);
        qWarning("QVariant::load: unable to load type %d.", d.type().id());
    }
}